

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

int bam_hdr_write(BGZF *fp,bam_hdr_t *h)

{
  uint32_t *data;
  uint uVar1;
  char *__s;
  size_t sVar2;
  long lVar3;
  int32_t *data_00;
  uint *data_01;
  bam_hdr_t *data_02;
  ulong uVar4;
  int32_t x;
  int32_t name_len;
  char buf [4];
  
  builtin_strncpy(buf,"BAM\x01",4);
  bgzf_write(fp,buf,4);
  data = &h->l_text;
  if ((fp->field_0x2 & 0xc) == 0) {
    bgzf_write(fp,data,4);
    data_02 = h;
    if ((ulong)*data != 0) {
      bgzf_write(fp,h->text,(ulong)*data);
    }
  }
  else {
    uVar1 = *data;
    x = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    bgzf_write(fp,(bam_hdr_t *)&x,4);
    if ((ulong)*data != 0) {
      bgzf_write(fp,h->text,(ulong)*data);
    }
    uVar1 = h->n_targets;
    x = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    data_02 = (bam_hdr_t *)&x;
  }
  bgzf_write(fp,data_02,4);
  lVar3 = 0;
  for (uVar4 = 0; uVar4 != (uint)h->n_targets; uVar4 = uVar4 + 1) {
    __s = *(char **)((long)h->target_name + lVar3 * 2);
    sVar2 = strlen(__s);
    name_len = (int)sVar2 + 1;
    data_00 = &name_len;
    if ((fp->field_0x2 & 0xc) != 0) {
      x = (uint)name_len >> 0x18 | (name_len & 0xff0000U) >> 8 | (name_len & 0xff00U) << 8 |
          name_len * 0x1000000;
      data_00 = &x;
    }
    bgzf_write(fp,data_00,4);
    bgzf_write(fp,__s,(long)name_len);
    data_01 = (uint *)((long)h->target_len + lVar3);
    if ((fp->field_0x2 & 0xc) != 0) {
      uVar1 = *data_01;
      x = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      data_01 = (uint *)&x;
    }
    bgzf_write(fp,data_01,4);
    lVar3 = lVar3 + 4;
  }
  bgzf_flush(fp);
  return 0;
}

Assistant:

int bam_hdr_write(BGZF *fp, const bam_hdr_t *h)
{
    char buf[4];
    int32_t i, name_len, x;
    // write "BAM1"
    strncpy(buf, "BAM\1", 4);
    bgzf_write(fp, buf, 4);
    // write plain text and the number of reference sequences
    if (fp->is_be) {
        x = ed_swap_4(h->l_text);
        bgzf_write(fp, &x, 4);
        if (h->l_text) bgzf_write(fp, h->text, h->l_text);
        x = ed_swap_4(h->n_targets);
        bgzf_write(fp, &x, 4);
    } else {
        bgzf_write(fp, &h->l_text, 4);
        if (h->l_text) bgzf_write(fp, h->text, h->l_text);
        bgzf_write(fp, &h->n_targets, 4);
    }
    // write sequence names and lengths
    for (i = 0; i != h->n_targets; ++i) {
        char *p = h->target_name[i];
        name_len = strlen(p) + 1;
        if (fp->is_be) {
            x = ed_swap_4(name_len);
            bgzf_write(fp, &x, 4);
        } else bgzf_write(fp, &name_len, 4);
        bgzf_write(fp, p, name_len);
        if (fp->is_be) {
            x = ed_swap_4(h->target_len[i]);
            bgzf_write(fp, &x, 4);
        } else bgzf_write(fp, &h->target_len[i], 4);
    }
    bgzf_flush(fp);
    return 0;
}